

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::TrigramAlphabet::MegaMatch(TrigramAlphabet *this,char16 *input,int inputLen)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  PatternTri *pPVar6;
  TrigramInfo *pTVar7;
  TrigramInfo *pTVar8;
  PatternTri *tri;
  int j_1;
  int bits;
  int j;
  bool validInput;
  int inputMask;
  int count;
  int t;
  int index;
  int k;
  uchar c3;
  uchar c2;
  uchar c1;
  int inputLen_local;
  char16 *input_local;
  TrigramAlphabet *this_local;
  
  this->input = input;
  this->inputLen = inputLen;
  if (7 < inputLen) {
    index._3_1_ = this->alphaBits[(int)((ushort)*input & 0x5f)];
    index._2_1_ = this->alphaBits[(int)((ushort)input[1] & 0x5f)];
    index._1_1_ = this->alphaBits[(int)((ushort)input[2] & 0x5f)];
    for (t = 3; t < inputLen + -5; t = t + 1) {
      uVar4 = (uint)index._3_1_ * 0x40 + (uint)index._2_1_ * 8 + (uint)index._1_1_;
      if (((uVar4 < 0xdd) && (iVar5 = (int)this->trigramMap[(int)uVar4], iVar5 != 0x41)) &&
         (iVar1 = this->trigramStarts[iVar5].count, 0 < iVar1)) {
        j = 0;
        bVar3 = true;
        for (j_1 = 0; j_1 < 5; j_1 = j_1 + 1) {
          if (0x7f < (ushort)input[t + j_1]) {
            bVar3 = false;
            break;
          }
          if (this->alphaBits[(int)((ushort)input[t + j_1] & 0x5f)] == 4) {
            bVar3 = false;
            break;
          }
          j = j * 0x10 + (1 << (this->alphaBits[(int)((ushort)input[t + j_1] & 0x5f)] & 0x1fU));
        }
        if (bVar3) {
          for (tri._4_4_ = 0; tri._4_4_ < iVar1; tri._4_4_ = tri._4_4_ + 1) {
            pPVar6 = this->trigramStarts[iVar5].patterns + tri._4_4_;
            if ((j & pPVar6->encodedPattern) == j) {
              pTVar7 = Memory::WriteBarrierPtr<UnifiedRegex::TrigramInfo>::operator->
                                 (&(pPVar6->pattern->rep).unified.trigramInfo);
              if (pTVar7->resultCount < 0x20) {
                pTVar7 = Memory::WriteBarrierPtr<UnifiedRegex::TrigramInfo>::operator->
                                   (&(pPVar6->pattern->rep).unified.trigramInfo);
                pTVar8 = Memory::WriteBarrierPtr<UnifiedRegex::TrigramInfo>::operator->
                                   (&(pPVar6->pattern->rep).unified.trigramInfo);
                iVar2 = pTVar8->resultCount;
                pTVar8->resultCount = iVar2 + 1;
                pTVar7->offsets[iVar2] = t + -3;
              }
              else {
                pTVar7 = Memory::WriteBarrierPtr<UnifiedRegex::TrigramInfo>::operator->
                                   (&(pPVar6->pattern->rep).unified.trigramInfo);
                pTVar7->isTrigramPattern = false;
              }
            }
          }
        }
      }
      index._3_1_ = index._2_1_;
      index._2_1_ = index._1_1_;
      index._1_1_ = this->alphaBits[(int)((ushort)input[t] & 0x5f)];
    }
  }
  return;
}

Assistant:

void TrigramAlphabet::MegaMatch(__in_ecount(inputLen) const char16* input,int inputLen) {
        this->input=input;
        this->inputLen=inputLen;
        if (inputLen<TrigramInfo::PatternLength) {
            return;
        }
        // prime the pump
        unsigned char c1=alphaBits[input[0]&UpperCaseMask];
        unsigned char c2=alphaBits[input[1]&UpperCaseMask];
        unsigned char c3=alphaBits[input[2]&UpperCaseMask];
        // pump
        for (int k=3;k<inputLen-5;k++) {
            int index=(c1<<6)+(c2<<3)+c3;
            if (index<TrigramMapSize) {
                int t=trigramMap[index];
                if (t!=TrigramNotInPattern) {
                    int count=trigramStarts[t].count;
                    if (count>0) {
                        int inputMask=0;
                        bool validInput=true;
                        for (int j=0;j<5;j++) {
                            // ascii check
                            if (input[k+j]<128) {
                                int bits=alphaBits[input[k+j]&UpperCaseMask];
                                if (bits==BitsNotInAlpha) {
                                    validInput=false;
                                    break;
                                }
                                inputMask=(inputMask<<AlphaCount)+(1<<bits);
                            }
                            else {
                                validInput=false;
                                break;
                            }
                        }
                        if (validInput) {
                            for (int j=0;j<count;j++) {
                                PatternTri* tri= &(trigramStarts[t].patterns[j]);
                                if ((inputMask&(tri->encodedPattern))==inputMask) {
                                    if (tri->pattern->rep.unified.trigramInfo->resultCount<TrigramInfo::MaxResults) {
                                        tri->pattern->rep.unified.trigramInfo->offsets[tri->pattern->rep.unified.trigramInfo->resultCount++]=k-3;
                                    }
                                    else {
                                        tri->pattern->rep.unified.trigramInfo->isTrigramPattern=false;
                                    }
                                }
                            }
                        }
                    }
                }
            }
            c1=c2;
            c2=c3;
            c3=alphaBits[input[k]&UpperCaseMask];
        }
    }